

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O1

void duckdb::BitpackingCompressionState<short,_true,_short>::BitpackingWriter::WriteDeltaFor
               (short *values,bool *validity,bitpacking_width_t width,short frame_of_reference,
               short delta_offset,short *original_values,idx_t count,void *data_ptr)

{
  int iVar1;
  int iVar2;
  long lVar3;
  unsigned_long uVar4;
  idx_t iVar5;
  ulong uVar6;
  short *psVar7;
  bitpacking_metadata_encoded_t encoded_value;
  uint16_t *out;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  uint16_t *puVar11;
  ulong uVar12;
  uint16_t local_78 [16];
  uint16_t local_58 [20];
  
  iVar5 = count;
  if ((count & 0x1f) != 0) {
    uVar4 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)count & 0x1f);
    iVar5 = (count - uVar4) + 0x20;
  }
  uVar12 = (ulong)width;
  uVar6 = iVar5 * uVar12 >> 3;
  FlushAndCreateSegmentIfFull
            ((BitpackingCompressionState<short,_true,_short> *)data_ptr,uVar6 + 6,4);
  iVar1 = *(int *)((long)data_ptr + 0x40);
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid
            ((optional_ptr<duckdb::FileBuffer,_true> *)((long)data_ptr + 0x38));
  lVar3 = *(long *)((long)data_ptr + 0x48);
  iVar2 = *(int *)(*(long *)((long)data_ptr + 0x38) + 0x10);
  *(long *)((long)data_ptr + 0x48) = lVar3 + -4;
  *(uint *)(lVar3 + -4) = iVar1 - iVar2 | 0x4000000;
  psVar7 = *(short **)((long)data_ptr + 0x40);
  *psVar7 = frame_of_reference;
  *(short **)((long)data_ptr + 0x40) = psVar7 + 1;
  psVar7[1] = (ushort)width;
  *(short **)((long)data_ptr + 0x40) = psVar7 + 2;
  psVar7[2] = delta_offset;
  psVar7 = psVar7 + 3;
  *(short **)((long)data_ptr + 0x40) = psVar7;
  uVar8 = count & 0xffffffffffffffe0;
  if (uVar8 != 0) {
    uVar9 = 0;
    uVar10 = 0;
    puVar11 = (uint16_t *)values;
    do {
      out = (uint16_t *)((uVar9 >> 3) + (long)psVar7);
      duckdb_fastpforlib::internal::fastpack_half(puVar11,out,(uint)width);
      duckdb_fastpforlib::internal::fastpack_half(puVar11 + 0x10,out + uVar12,(uint)width);
      uVar10 = uVar10 + 0x20;
      puVar11 = puVar11 + 0x20;
      uVar9 = uVar9 + (ulong)width * 0x20;
    } while (uVar10 < uVar8);
  }
  if ((count & 0x1f) != 0) {
    uVar9 = (ulong)(((uint)count & 0x1f) * 2);
    switchD_0130b471::default((void *)((long)local_78 + uVar9),0,0x40 - uVar9);
    switchD_012e1ce8::default(local_78,values + uVar8,uVar9);
    puVar11 = (uint16_t *)((long)psVar7 + (uVar8 * uVar12 >> 3));
    duckdb_fastpforlib::internal::fastpack_half(local_78,puVar11,(uint)width);
    duckdb_fastpforlib::internal::fastpack_half(local_58,puVar11 + uVar12,(uint)width);
  }
  *(long *)((long)data_ptr + 0x40) = *(long *)((long)data_ptr + 0x40) + uVar6;
  UpdateStats((BitpackingCompressionState<short,_true,_short> *)data_ptr,count);
  return;
}

Assistant:

static void WriteDeltaFor(T *values, bool *validity, bitpacking_width_t width, T frame_of_reference,
		                          T_S delta_offset, T *original_values, idx_t count, void *data_ptr) {
			auto state = reinterpret_cast<BitpackingCompressionState<T, WRITE_STATISTICS> *>(data_ptr);

			auto bp_size = BitpackingPrimitives::GetRequiredSize(count, width);
			ReserveSpace(state, bp_size + 3 * sizeof(T));

			WriteMetaData(state, BitpackingMode::DELTA_FOR);
			WriteData(state->data_ptr, frame_of_reference);
			WriteData(state->data_ptr, static_cast<T>(width));
			WriteData(state->data_ptr, delta_offset);

			BitpackingPrimitives::PackBuffer<T, false>(state->data_ptr, values, count, width);
			state->data_ptr += bp_size;

			UpdateStats(state, count);
		}